

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_third_step1.cpp
# Opt level: O0

void __thiscall
ruckig::PositionThirdOrderStep1::time_acc0_acc1
          (PositionThirdOrderStep1 *this,ProfileIter *profile,double vMax,double vMin,double aMax,
          double aMin,double jMax,bool return_after_found)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  reference pvVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double h3;
  double h2;
  double h1;
  bool return_after_found_local;
  double jMax_local;
  double aMin_local;
  double aMax_local;
  double vMin_local;
  double vMax_local;
  ProfileIter *profile_local;
  PositionThirdOrderStep1 *this_local;
  
  dVar5 = (jMax * 12.0 *
           (-(aMax * this->af_af) * this->vf +
           aMax * aMin *
           ((aMax - (this->a0 + this->a0)) * this->v0 + -((aMin - (this->af + this->af)) * this->vf)
           ) + aMin * this->a0_a0 * this->v0) +
          (this->af_p4 * aMax + -(this->a0_p4 * aMin)) * 3.0 +
          aMax * aMin *
          (-(aMax * 6.0) * this->a0_a0 +
          aMin * 6.0 * this->af_af +
          (this->a0_p3 - this->af_p3) * 8.0 + aMax * 3.0 * aMin * (aMax - aMin))) /
          ((aMax - aMin) * 3.0 * this->jMax_jMax) +
          ((-(aMin * 2.0 * aMax) * this->pd + aMax * this->vf_vf + -(aMin * this->v0_v0)) * 4.0) /
          (aMax - aMin);
  if (0.0 <= dVar5) {
    dVar5 = sqrt(dVar5);
    dVar5 = dVar5 / 2.0;
    dVar6 = (this->a0_a0 / (aMax * 2.0 * jMax) + (aMin - (aMax + aMax)) / (jMax * 2.0)) -
            this->v0 / aMax;
    dVar7 = (-this->af_af / (aMin * 2.0 * jMax) - (aMax - (aMin + aMin)) / (jMax * 2.0)) +
            this->vf / aMin;
    if ((dVar5 / aMax < dVar6) && (-dVar5 / aMin < dVar7)) {
      dVar1 = this->a0;
      pvVar4 = std::array<double,_7UL>::operator[](&(*profile)->t,0);
      *pvVar4 = (-dVar1 + aMax) / jMax;
      pvVar4 = std::array<double,_7UL>::operator[](&(*profile)->t,1);
      *pvVar4 = dVar6 - dVar5 / aMax;
      pvVar4 = std::array<double,_7UL>::operator[](&(*profile)->t,2);
      *pvVar4 = aMax / jMax;
      pvVar4 = std::array<double,_7UL>::operator[](&(*profile)->t,3);
      *pvVar4 = 0.0;
      pvVar4 = std::array<double,_7UL>::operator[](&(*profile)->t,4);
      *pvVar4 = -aMin / jMax;
      pvVar4 = std::array<double,_7UL>::operator[](&(*profile)->t,5);
      *pvVar4 = dVar7 + dVar5 / aMin;
      pvVar4 = std::array<double,_7UL>::operator[](&(*profile)->t,4);
      dVar1 = *pvVar4;
      dVar2 = this->af;
      pvVar4 = std::array<double,_7UL>::operator[](&(*profile)->t,6);
      *pvVar4 = dVar1 + dVar2 / jMax;
      bVar3 = Profile::
              check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)4,true>
                        (*profile,jMax,vMax,vMin,aMax,aMin);
      if ((bVar3) && (add_profile(this,profile), return_after_found)) {
        return;
      }
    }
    if ((-dVar5 / aMax < dVar6) && (dVar5 / aMin < dVar7)) {
      dVar1 = this->a0;
      pvVar4 = std::array<double,_7UL>::operator[](&(*profile)->t,0);
      *pvVar4 = (-dVar1 + aMax) / jMax;
      pvVar4 = std::array<double,_7UL>::operator[](&(*profile)->t,1);
      *pvVar4 = dVar6 + dVar5 / aMax;
      pvVar4 = std::array<double,_7UL>::operator[](&(*profile)->t,2);
      *pvVar4 = aMax / jMax;
      pvVar4 = std::array<double,_7UL>::operator[](&(*profile)->t,3);
      *pvVar4 = 0.0;
      pvVar4 = std::array<double,_7UL>::operator[](&(*profile)->t,4);
      *pvVar4 = -aMin / jMax;
      pvVar4 = std::array<double,_7UL>::operator[](&(*profile)->t,5);
      *pvVar4 = dVar7 - dVar5 / aMin;
      pvVar4 = std::array<double,_7UL>::operator[](&(*profile)->t,4);
      dVar5 = *pvVar4;
      dVar6 = this->af;
      pvVar4 = std::array<double,_7UL>::operator[](&(*profile)->t,6);
      *pvVar4 = dVar5 + dVar6 / jMax;
      bVar3 = Profile::
              check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)4,true>
                        (*profile,jMax,vMax,vMin,aMax,aMin);
      if (bVar3) {
        add_profile(this,profile);
      }
    }
  }
  return;
}

Assistant:

void PositionThirdOrderStep1::time_acc0_acc1(ProfileIter& profile, double vMax, double vMin, double aMax, double aMin, double jMax, bool return_after_found) const {
    double h1 = (3*(af_p4*aMax - a0_p4*aMin) + aMax*aMin*(8*(a0_p3 - af_p3) + 3*aMax*aMin*(aMax - aMin) + 6*aMin*af_af - 6*aMax*a0_a0) + 12*jMax*(aMax*aMin*((aMax - 2*a0)*v0 - (aMin - 2*af)*vf) + aMin*a0_a0*v0 - aMax*af_af*vf))/(3*(aMax - aMin)*jMax_jMax) + 4*(aMax*vf_vf - aMin*v0_v0 - 2*aMin*aMax*pd)/(aMax - aMin);

    if (h1 >= 0) {
        h1 = std::sqrt(h1) / 2;
        const double h2 = a0_a0/(2*aMax*jMax) + (aMin - 2*aMax)/(2*jMax) - v0/aMax;
        const double h3 = -af_af/(2*aMin*jMax) - (aMax - 2*aMin)/(2*jMax) + vf/aMin;

        // UDDU: Solution 2
        if (h2 > h1/aMax && h3 > -h1/aMin) {
            profile->t[0] = (-a0 + aMax)/jMax;
            profile->t[1] = h2 - h1/aMax;
            profile->t[2] = aMax/jMax;
            profile->t[3] = 0;
            profile->t[4] = -aMin/jMax;
            profile->t[5] = h3 + h1/aMin;
            profile->t[6] = profile->t[4] + af/jMax;

            if (profile->check<ControlSigns::UDDU, ReachedLimits::ACC0_ACC1, true>(jMax, vMax, vMin, aMax, aMin)) {
                add_profile(profile);
                if (return_after_found) {
                    return;
                }
            }
        }

        // UDDU: Solution 1
        if (h2 > -h1/aMax && h3 > h1/aMin) {
            profile->t[0] = (-a0 + aMax)/jMax;
            profile->t[1] = h2 + h1/aMax;
            profile->t[2] = aMax/jMax;
            profile->t[3] = 0;
            profile->t[4] = -aMin/jMax;
            profile->t[5] = h3 - h1/aMin;
            profile->t[6] = profile->t[4] + af/jMax;

            if (profile->check<ControlSigns::UDDU, ReachedLimits::ACC0_ACC1, true>(jMax, vMax, vMin, aMax, aMin)) {
                add_profile(profile);
            }
        }
    }
}